

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void TPZFMatrix<long_double>::PrintStatic
               (longdouble *ptr,int64_t rows,int64_t cols,char *name,ostream *out,
               MatrixOutputFormat form)

{
  longdouble lVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  longdouble *plVar5;
  ulong uVar6;
  int64_t col;
  int64_t iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  char number [32];
  
  if (form == EMathematicaInput) {
    poVar2 = std::operator<<(out,name);
    std::operator<<(poVar2,"\n{ ");
    lVar9 = 0;
    iVar7 = cols;
    if (cols < 1) {
      iVar7 = lVar9;
    }
    lVar3 = 0;
    if (0 < rows) {
      lVar3 = rows;
    }
    for (; lVar9 != lVar3; lVar9 = lVar9 + 1) {
      std::operator<<(out,"\n{ ");
      uVar6 = 1;
      lVar8 = 0;
      plVar5 = ptr;
      while( true ) {
        if (iVar7 == lVar8) break;
        sprintf(number,"%16.16lf",ABS((double)*plVar5),uVar6 % 6);
        std::operator<<(out,number);
        if (lVar8 < cols + -1) {
          std::operator<<(out,", ");
        }
        if ((uVar6 / 6) * 6 + -1 == lVar8) {
          std::endl<char,std::char_traits<char>>(out);
        }
        plVar5 = plVar5 + rows;
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 1;
      }
      std::operator<<(out," }");
      if (lVar9 < rows + -1) {
        std::operator<<(out,",");
      }
      ptr = ptr + 1;
    }
    std::operator<<(out," }\n");
    return;
  }
  if (form == EInputFormat) {
    poVar2 = std::ostream::_M_insert<long>((long)out);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar9 = 0;
    if (cols < 1) {
      cols = lVar9;
    }
    lVar3 = 0;
    if (0 < rows) {
      lVar3 = rows;
    }
    for (; lVar9 != lVar3; lVar9 = lVar9 + 1) {
      plVar5 = ptr;
      for (lVar8 = 0; cols != lVar8; lVar8 = lVar8 + 1) {
        lVar1 = *plVar5;
        if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
          poVar2 = std::ostream::_M_insert<long>((long)out);
          poVar2 = std::operator<<(poVar2,' ');
          poVar2 = std::ostream::_M_insert<long>((long)poVar2);
          std::operator<<(poVar2,' ');
          poVar2 = std::ostream::_M_insert<long_double>(lVar1);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        plVar5 = plVar5 + rows;
      }
      ptr = ptr + 1;
    }
    pcVar4 = "-1 -1 0.\n";
  }
  else {
    if (form != EFormatted) {
      return;
    }
    std::operator<<(out,"Writing matrix \'");
    if (name != (char *)0x0) {
      std::operator<<(out,name);
    }
    poVar2 = std::operator<<(out,"\' (");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2," x ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,"):\n");
    lVar9 = 0;
    if (cols < 1) {
      cols = lVar9;
    }
    lVar3 = 0;
    if (0 < rows) {
      lVar3 = rows;
    }
    for (; lVar9 != lVar3; lVar9 = lVar9 + 1) {
      std::operator<<(out,"\t");
      plVar5 = ptr;
      iVar7 = cols;
      while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
        poVar2 = std::ostream::_M_insert<long_double>(*plVar5);
        std::operator<<(poVar2,"  ");
        plVar5 = plVar5 + rows;
      }
      std::operator<<(out,"\n");
      ptr = ptr + 1;
    }
    pcVar4 = "\n";
  }
  std::operator<<(out,pcVar4);
  return;
}

Assistant:

void TPZFMatrix<TVar>::PrintStatic(const TVar *ptr, int64_t rows, int64_t cols, const char *name, std::ostream& out,const MatrixOutputFormat form){
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << rows << " x " << cols << "):\n";
        
        for ( int64_t row = 0; row < rows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < cols; col++ ) {
                out << SELECTEL(ptr,rows, row, col) << "  ";
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << rows << " " << cols << endl;
        for ( int64_t row = 0; row < rows; row++) {
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
    {
        char number[32];
        out << name << "\n{ ";
        for ( int64_t row = 0; row < rows; row++) {
            out << "\n{ ";
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                sprintf(number, "%16.16lf", (double)fabs(val));
                out << number;
                if(col < cols-1)
                    out << ", ";
                if((col+1) % 6 == 0)out << std::endl;
            }
            out << " }";
            if(row < rows-1)
                out << ",";
        }
        
        out << " }\n";
        
    }
    
}